

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O2

void __thiscall
BayesianGameForDecPOMDPStage::SoftPrint_abi_cxx11_(BayesianGameForDecPOMDPStage *this)

{
  long in_RSI;
  
  SoftPrint_abi_cxx11_((string *)this,(BayesianGameForDecPOMDPStage *)(in_RSI + -0x20));
  return;
}

Assistant:

string BayesianGameForDecPOMDPStage::SoftPrint() const
{
    stringstream ss;
    ss << "Bayesian Game for stage t="<<GetStage()<<" of a Dec-POMDP"<<endl;
    if(GetPastJointPolicy() != 0)
        ss<< "Past policy that lead to this BG=" << GetPastJointPolicy()->SoftPrint()<<endl;
    ss << BayesianGameIdenticalPayoff::SoftPrint();    
    return(ss.str());
}